

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_vine_swap.h
# Opt level: O1

Index __thiscall
Gudhi::persistence_matrix::
Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
::_positive_vine_swap
          (Chain_vine_swap<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
           *this,Index columnIndex1,Index columnIndex2)

{
  uint uVar1;
  Dimension DVar2;
  uint uVar3;
  undefined4 uVar4;
  _Invoker_type p_Var5;
  _Manager_type p_Var6;
  bool bVar7;
  ID_index IVar8;
  long lVar9;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
  *pIVar10;
  Column *col;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
  *pIVar11;
  ID_index IVar12;
  long lVar13;
  long lVar14;
  anon_class_1_0_00000001 local_47;
  anon_class_1_0_00000001 local_46;
  anon_class_1_0_00000001 local_45;
  Index local_44;
  anon_class_8_1_e4bd5e45 local_40;
  ulong local_38;
  
  p_Var5 = this[1].deathComp_._M_invoker;
  lVar13 = (ulong)columnIndex1 * 0x40;
  lVar14 = (ulong)columnIndex2 * 0x40;
  pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
             *)(p_Var5 + lVar14);
  local_44 = columnIndex2;
  if (*(int *)(p_Var5 + lVar13 + 0x18) == -1) {
    local_40.targetColumn._0_4_ = columnIndex1;
    if ((this->birthComp_).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001baa3e:
      local_40.targetColumn._0_4_ = columnIndex1;
      std::__throw_bad_function_call();
    }
    bVar7 = (*(this->birthComp_)._M_invoker)((_Any_data *)this,(uint *)&local_40,&local_44);
    p_Var5 = this[1].deathComp_._M_invoker;
    if ((bVar7) && ((pIVar11->super_Chain_column_option).pairedColumn_ == 0xffffffff)) {
      pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
                 *)(p_Var5 + lVar14);
      IVar12 = *(ID_index *)(p_Var5 + lVar14 + 0x14);
      pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
                 *)(p_Var5 + lVar13);
      local_40.targetColumn = pIVar11;
      bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,true,false,true,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                        (pIVar10,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                         &local_46,&local_47);
      if (bVar7) {
        IVar8 = (pIVar11->super_Chain_column_option).pivot_;
        (pIVar11->super_Chain_column_option).pivot_ = (pIVar10->super_Chain_column_option).pivot_;
        (pIVar10->super_Chain_column_option).pivot_ = IVar8;
        DVar2 = (pIVar11->super_Column_dimension_option).dim_;
        (pIVar11->super_Column_dimension_option).dim_ =
             (pIVar10->super_Column_dimension_option).dim_;
        (pIVar10->super_Column_dimension_option).dim_ = DVar2;
      }
      IVar8 = (pIVar11->super_Chain_column_option).pivot_;
      local_38._0_4_ = columnIndex1;
      if (IVar12 == IVar8) {
        return columnIndex1;
      }
      goto LAB_001baa14;
    }
    IVar12 = *(ID_index *)(p_Var5 + lVar13 + 0x14);
LAB_001ba9bc:
    pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
               *)(p_Var5 + lVar13);
    pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
               *)(p_Var5 + lVar14);
    local_40.targetColumn = pIVar11;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,true,false,true,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar10,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    if (bVar7) {
      IVar8 = (pIVar11->super_Chain_column_option).pivot_;
      (pIVar11->super_Chain_column_option).pivot_ = (pIVar10->super_Chain_column_option).pivot_;
      (pIVar10->super_Chain_column_option).pivot_ = IVar8;
      DVar2 = (pIVar11->super_Column_dimension_option).dim_;
      (pIVar11->super_Column_dimension_option).dim_ = (pIVar10->super_Column_dimension_option).dim_;
      (pIVar10->super_Column_dimension_option).dim_ = DVar2;
    }
  }
  else {
    pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
               *)(p_Var5 + lVar13);
    if ((pIVar11->super_Chain_column_option).pairedColumn_ != 0xffffffff) {
      local_38 = CONCAT44(local_38._4_4_,columnIndex1);
      local_40.targetColumn._0_4_ = columnIndex1;
      if ((this->deathComp_).super__Function_base._M_manager == (_Manager_type)0x0)
      goto LAB_001baa3e;
      bVar7 = (*(this->deathComp_)._M_invoker)
                        ((_Any_data *)&this->deathComp_,(uint *)&local_40,&local_44);
      p_Var5 = this[1].deathComp_._M_invoker;
      if (bVar7) {
        lVar9 = (ulong)(pIVar11->super_Chain_column_option).pairedColumn_ * 0x40;
        pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
                   *)(p_Var5 + lVar9);
        uVar1 = *(uint *)(p_Var5 + lVar9 + 0x14);
        pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
                   *)(p_Var5 + (ulong)(pIVar10->super_Chain_column_option).pairedColumn_ * 0x40);
        local_40.targetColumn = pIVar11;
        bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,true,false,true,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                          (pIVar10,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                           &local_46,&local_47);
        if (bVar7) {
          IVar12 = (pIVar11->super_Chain_column_option).pivot_;
          (pIVar11->super_Chain_column_option).pivot_ = (pIVar10->super_Chain_column_option).pivot_;
          (pIVar10->super_Chain_column_option).pivot_ = IVar12;
          DVar2 = (pIVar11->super_Column_dimension_option).dim_;
          (pIVar11->super_Column_dimension_option).dim_ =
               (pIVar10->super_Column_dimension_option).dim_;
          (pIVar10->super_Column_dimension_option).dim_ = DVar2;
        }
        uVar3 = (pIVar11->super_Chain_column_option).pivot_;
        if (uVar1 != uVar3) {
          p_Var6 = this[2].birthComp_.super__Function_base._M_manager;
          uVar4 = *(undefined4 *)(p_Var6 + (ulong)uVar1 * 4);
          *(undefined4 *)(p_Var6 + (ulong)uVar1 * 4) = *(undefined4 *)(p_Var6 + (ulong)uVar3 * 4);
          *(undefined4 *)(p_Var6 + (ulong)uVar3 * 4) = uVar4;
        }
        p_Var5 = this[1].deathComp_._M_invoker;
        pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
                   *)(p_Var5 + lVar14);
        IVar12 = *(ID_index *)(p_Var5 + lVar14 + 0x14);
        pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
                   *)(p_Var5 + lVar13);
        local_40.targetColumn = pIVar11;
        bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,true,false,true,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                          (pIVar10,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                           &local_46,&local_47);
        if (bVar7) {
          IVar8 = (pIVar11->super_Chain_column_option).pivot_;
          (pIVar11->super_Chain_column_option).pivot_ = (pIVar10->super_Chain_column_option).pivot_;
          (pIVar10->super_Chain_column_option).pivot_ = IVar8;
          DVar2 = (pIVar11->super_Column_dimension_option).dim_;
          (pIVar11->super_Column_dimension_option).dim_ =
               (pIVar10->super_Column_dimension_option).dim_;
          (pIVar10->super_Column_dimension_option).dim_ = DVar2;
        }
        IVar8 = (pIVar11->super_Chain_column_option).pivot_;
        if (IVar12 == IVar8) {
          return (Index)local_38;
        }
        goto LAB_001baa14;
      }
      lVar9 = (ulong)(pIVar10->super_Chain_column_option).pairedColumn_ * 0x40;
      pIVar10 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
                 *)(p_Var5 + lVar9);
      local_38 = (ulong)*(uint *)(p_Var5 + lVar9 + 0x14);
      pIVar11 = (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_false,_false,_true>_>_>
                 *)(p_Var5 + (ulong)(pIVar11->super_Chain_column_option).pairedColumn_ * 0x40);
      local_40.targetColumn = pIVar10;
      bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,true,false,true,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                        (pIVar11,pIVar10,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                         &local_46,&local_47);
      if (bVar7) {
        IVar12 = (pIVar10->super_Chain_column_option).pivot_;
        (pIVar10->super_Chain_column_option).pivot_ = (pIVar11->super_Chain_column_option).pivot_;
        (pIVar11->super_Chain_column_option).pivot_ = IVar12;
        DVar2 = (pIVar10->super_Column_dimension_option).dim_;
        (pIVar10->super_Column_dimension_option).dim_ =
             (pIVar11->super_Column_dimension_option).dim_;
        (pIVar11->super_Column_dimension_option).dim_ = DVar2;
      }
      uVar1 = (pIVar10->super_Chain_column_option).pivot_;
      if ((uint)local_38 != uVar1) {
        p_Var6 = this[2].birthComp_.super__Function_base._M_manager;
        uVar4 = *(undefined4 *)(p_Var6 + local_38 * 4);
        *(undefined4 *)(p_Var6 + local_38 * 4) = *(undefined4 *)(p_Var6 + (ulong)uVar1 * 4);
        *(undefined4 *)(p_Var6 + (ulong)uVar1 * 4) = uVar4;
      }
      p_Var5 = this[1].deathComp_._M_invoker;
      IVar12 = *(ID_index *)(p_Var5 + lVar13 + 0x14);
      goto LAB_001ba9bc;
    }
    IVar12 = (pIVar11->super_Chain_column_option).pivot_;
    local_40.targetColumn = pIVar11;
    bVar7 = _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,false,false,true>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gud____matrix::Column_types)7,true,false,true,false,false,false,true>>::Matrix_column_tag,1u>,false>___1_>
                      (pIVar10,pIVar11,(anon_class_1_0_00000001 *)&local_44,&local_40,&local_45,
                       &local_46,&local_47);
    columnIndex2 = columnIndex1;
    if (bVar7) {
      IVar8 = (pIVar11->super_Chain_column_option).pivot_;
      (pIVar11->super_Chain_column_option).pivot_ = (pIVar10->super_Chain_column_option).pivot_;
      (pIVar10->super_Chain_column_option).pivot_ = IVar8;
      DVar2 = (pIVar11->super_Column_dimension_option).dim_;
      (pIVar11->super_Column_dimension_option).dim_ = (pIVar10->super_Column_dimension_option).dim_;
      (pIVar10->super_Column_dimension_option).dim_ = DVar2;
    }
  }
  IVar8 = (pIVar11->super_Chain_column_option).pivot_;
  local_38._0_4_ = columnIndex2;
  if (IVar12 == IVar8) {
    return columnIndex2;
  }
LAB_001baa14:
  p_Var6 = this[2].birthComp_.super__Function_base._M_manager;
  uVar4 = *(undefined4 *)(p_Var6 + (ulong)IVar12 * 4);
  *(undefined4 *)(p_Var6 + (ulong)IVar12 * 4) = *(undefined4 *)(p_Var6 + (ulong)IVar8 * 4);
  *(undefined4 *)(p_Var6 + (ulong)IVar8 * 4) = uVar4;
  return (Index)local_38;
}

Assistant:

inline typename Chain_vine_swap<Master_matrix>::Index Chain_vine_swap<Master_matrix>::_positive_vine_swap(
    Index columnIndex1, Index columnIndex2)
{
  auto& col1 = _matrix()->get_column(columnIndex1);
  auto& col2 = _matrix()->get_column(columnIndex2);

  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    CP::swap_positions(col1.get_pivot(), col2.get_pivot());
  }
  // TODO: factorize the cases
  // But for debug it is much more easier to understand what is happening when split like this
  if (!col1.is_paired()) {  // F x *
    bool hasSmallerBirth;
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      // this order because position were swapped with CP::swap_positions
      hasSmallerBirth = (CP::birth(col2.get_pivot()) < CP::birth(col1.get_pivot()));
    } else {
      hasSmallerBirth = birthComp_(columnIndex1, columnIndex2);
    }

    if (!col2.is_paired() && hasSmallerBirth) {
      _matrix()->add_to(columnIndex1, columnIndex2);
      if constexpr (Master_matrix::Option_list::has_column_pairings) {
        CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
      }
      return columnIndex1;
    }
    _matrix()->add_to(columnIndex2, columnIndex1);

    return columnIndex2;
  }

  if (!col2.is_paired()) {  // G x F
    static_cast<Master_chain_matrix*>(this)->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  bool hasSmallerDeath;
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    // this order because position were swapped with CP::swap_positions
    hasSmallerDeath = (CP::death(col2.get_pivot()) < CP::death(col1.get_pivot()));
  } else {
    hasSmallerDeath = deathComp_(columnIndex1, columnIndex2);
  }

  // G x G
  if (hasSmallerDeath)
  {
    _matrix()->add_to(col1.get_paired_chain_index(), col2.get_paired_chain_index());
    _matrix()->add_to(columnIndex1, columnIndex2);
    if constexpr (Master_matrix::Option_list::has_column_pairings) {
      CP::positive_transpose(col1.get_pivot(), col2.get_pivot());
    }
    return columnIndex1;
  }

  _matrix()->add_to(col2.get_paired_chain_index(), col1.get_paired_chain_index());
  _matrix()->add_to(columnIndex2, columnIndex1);

  return columnIndex2;
}